

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseDataModuleField(WastParser *this,Module *module)

{
  DataSegment *pDVar1;
  bool bVar2;
  Result RVar3;
  Enum EVar4;
  ExprList *out_expr_list;
  DataSegmentModuleField *local_c0;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_b8;
  Location loc;
  string name;
  Var local_70;
  
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  RVar3 = Expect(this,Data);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&name);
  MakeUnique<wabt::DataSegmentModuleField,wabt::Location&,std::__cxx11::string&>
            ((wabt *)&local_c0,&loc,&name);
  bVar2 = PeekMatchLpar(this,Memory);
  if (bVar2) {
    RVar3 = Expect(this,Lpar);
    EVar4 = Error;
    if ((((RVar3.enum_ == Error) || (RVar3 = Expect(this,Memory), RVar3.enum_ == Error)) ||
        (RVar3 = ParseVar(this,&(local_c0->data_segment).memory_var), RVar3.enum_ == Error)) ||
       ((RVar3 = Expect(this,Rpar), RVar3.enum_ == Error ||
        (RVar3 = ParseOffsetExpr(this,&(local_c0->data_segment).offset), RVar3.enum_ == Error))))
    goto LAB_001786ac;
LAB_0017862d:
    ParseTextListOpt(this,&(local_c0->data_segment).data);
    RVar3 = Expect(this,Rpar);
    if (RVar3.enum_ != Error) {
      local_b8._M_head_impl = local_c0;
      local_c0 = (DataSegmentModuleField *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                  *)&local_b8);
      if (local_b8._M_head_impl != (DataSegmentModuleField *)0x0) {
        (*((local_b8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_b8._M_head_impl = (DataSegmentModuleField *)0x0;
      EVar4 = Ok;
      goto LAB_001786ac;
    }
  }
  else {
    pDVar1 = &local_c0->data_segment;
    Var::Var(&local_70,0,&loc);
    bVar2 = ParseVarOpt(this,&pDVar1->memory_var,&local_70);
    Var::~Var(&local_70);
    out_expr_list = &(local_c0->data_segment).offset;
    if (!bVar2) {
      bVar2 = ParseOffsetExprOpt(this,out_expr_list);
      if (!bVar2) {
        if ((this->options_->features).bulk_memory_enabled_ == false) {
          Error(this,0x1aec93);
          goto LAB_001786a9;
        }
        (local_c0->data_segment).kind = Passive;
      }
      goto LAB_0017862d;
    }
    RVar3 = ParseOffsetExpr(this,out_expr_list);
    if (RVar3.enum_ != Error) goto LAB_0017862d;
  }
LAB_001786a9:
  EVar4 = Error;
LAB_001786ac:
  if (local_c0 != (DataSegmentModuleField *)0x0) {
    (*(local_c0->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  std::__cxx11::string::_M_dispose();
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseDataModuleField(Module* module) {
  WABT_TRACE(ParseDataModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Data);
  std::string name;
  ParseBindVarOpt(&name);
  auto field = MakeUnique<DataSegmentModuleField>(loc, name);

  if (PeekMatchLpar(TokenType::Memory)) {
    EXPECT(Lpar);
    EXPECT(Memory);
    CHECK_RESULT(ParseVar(&field->data_segment.memory_var));
    EXPECT(Rpar);
    CHECK_RESULT(ParseOffsetExpr(&field->data_segment.offset));
  } else if (ParseVarOpt(&field->data_segment.memory_var, Var(0, loc))) {
    CHECK_RESULT(ParseOffsetExpr(&field->data_segment.offset));
  } else if (!ParseOffsetExprOpt(&field->data_segment.offset)) {
    if (!options_->features.bulk_memory_enabled()) {
      Error(loc, "passive data segments are not allowed");
      return Result::Error;
    }

    field->data_segment.kind = SegmentKind::Passive;
  }

  ParseTextListOpt(&field->data_segment.data);
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}